

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O3

DateTime FindCrossingPoint(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *initial_time1,
                          DateTime *initial_time2,bool finding_aos)

{
  DateTime DVar1;
  long lVar2;
  undefined7 in_register_00000081;
  int iVar3;
  DateTime DVar4;
  int64_t iVar5;
  DateTime local_108;
  long local_100;
  CoordTopocentric topo;
  Observer obs;
  Eci eci;
  
  libsgp4::Observer::Observer(&obs,user_geo);
  DVar4 = (DateTime)initial_time1->m_encoded;
  iVar5 = initial_time2->m_encoded;
  local_108.m_encoded = 0;
  libsgp4::DateTime::Initialise(&local_108,1,1,1,0,0,0,0);
  local_100 = -1000000;
  if ((int)CONCAT71(in_register_00000081,finding_aos) != 0) {
    local_100 = 1000000;
  }
  iVar3 = 0x10;
  while( true ) {
    local_108.m_encoded =
         (long)(((double)(iVar5 - DVar4.m_encoded) / 1000000.0) * 0.5 * 1000000.0) + DVar4.m_encoded
    ;
    libsgp4::SGP4::FindPosition(&eci,sgp4,&local_108);
    libsgp4::Observer::GetLookAngle(&topo,&obs,&eci);
    DVar1.m_encoded = local_108.m_encoded;
    if (0.0 < topo.elevation != finding_aos) {
      DVar4.m_encoded = local_108.m_encoded;
      DVar1.m_encoded = iVar5;
    }
    iVar5 = DVar1.m_encoded;
    if ((double)(iVar5 - DVar4.m_encoded) / 1000000.0 < 1.0) break;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
LAB_00102823:
      lVar2 = 1000000;
      if (finding_aos) {
        lVar2 = -1000000;
      }
      iVar3 = 6;
      do {
        libsgp4::SGP4::FindPosition(&eci,sgp4,&local_108);
        libsgp4::Observer::GetLookAngle(&topo,&obs,&eci);
        if (topo.elevation <= 0.0) {
          return (DateTime)local_108.m_encoded;
        }
        local_108.m_encoded = local_108.m_encoded + lVar2;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      return (DateTime)local_108.m_encoded;
    }
  }
  local_108.m_encoded = (local_108.m_encoded / 1000000) * 1000000 + local_100;
  goto LAB_00102823;
}

Assistant:

libsgp4::DateTime FindCrossingPoint(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& initial_time1,
        const libsgp4::DateTime& initial_time2,
        bool finding_aos)
{
    libsgp4::Observer obs(user_geo);

    bool running;
    int cnt;

    libsgp4::DateTime time1(initial_time1);
    libsgp4::DateTime time2(initial_time2);
    libsgp4::DateTime middle_time;

    running = true;
    cnt = 0;
    while (running && cnt++ < 16)
    {
        middle_time = time1.AddSeconds((time2 - time1).TotalSeconds() / 2.0);
        /*
         * calculate satellite position
         */
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

        if (topo.elevation > 0.0)
        {
            /*
             * satellite above horizon
             */
            if (finding_aos)
            {
                time2 = middle_time;
            }
            else
            {
                time1 = middle_time;
            }
        }
        else
        {
            if (finding_aos)
            {
                time1 = middle_time;
            }
            else
            {
                time2 = middle_time;
            }
        }

        if ((time2 - time1).TotalSeconds() < 1.0)
        {
            /*
             * two times are within a second, stop
             */
            running = false;
            /*
             * remove microseconds
             */
            int us = middle_time.Microsecond();
            middle_time = middle_time.AddMicroseconds(-us);
            /*
             * step back into the pass by 1 second
             */
            middle_time = middle_time.AddSeconds(finding_aos ? 1 : -1);
        }
    }

    /*
     * go back/forward 1second until below the horizon
     */
    running = true;
    cnt = 0;
    while (running && cnt++ < 6)
    {
        libsgp4::Eci eci = sgp4.FindPosition(middle_time);
        libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);
        if (topo.elevation > 0)
        {
            middle_time = middle_time.AddSeconds(finding_aos ? -1 : 1);
        }
        else
        {
            running = false;
        }
    }

    return middle_time;
}